

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ptrlist.c
# Opt level: O0

void raviX_ptrlist_concat(PtrList *a,PtrList **self)

{
  void *local_40;
  void *ptr;
  PtrListIterator iter;
  C_MemoryAllocator *alloc;
  PtrList **self_local;
  PtrList *a_local;
  
  iter.__nr = 0;
  iter._20_4_ = 0;
  raviX_ptrlist_forward_iterator((PtrListIterator *)&ptr,a);
  if (a == (PtrList *)0x0) {
    if (*self == (PtrList *)0x0) {
      return;
    }
    iter._16_8_ = (*self)->allocator_;
  }
  else {
    iter._16_8_ = a->allocator_;
  }
  local_40 = raviX_ptrlist_iter_next((PtrListIterator *)&ptr);
  while (local_40 != (void *)0x0) {
    raviX_ptrlist_add(self,local_40,(C_MemoryAllocator *)iter._16_8_);
    local_40 = raviX_ptrlist_iter_next((PtrListIterator *)&ptr);
  }
  return;
}

Assistant:

void raviX_ptrlist_concat(PtrList *a, PtrList **self)
{
	C_MemoryAllocator *alloc = NULL;
	PtrListIterator iter = raviX_ptrlist_forward_iterator(a);
	if (a)
		alloc = a->allocator_;
	else if (*self)
		alloc = (*self)->allocator_;
	else
		return;
	for (void *ptr = raviX_ptrlist_iter_next(&iter); ptr != NULL; ptr = raviX_ptrlist_iter_next(&iter)) {
		raviX_ptrlist_add(self, ptr, alloc);
	}
}